

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::operationToDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Operation *operations,
          bool useBranch)

{
  uint uVar1;
  string *psVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  ostringstream stream;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"Test ",5);
  uVar1 = *(uint *)this;
  if ((uVar1 & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"atomicCounter()",0xf)
    ;
    uVar1 = *(uint *)this;
  }
  if ((uVar1 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198," atomicCounterIncrement()",0x19);
    uVar1 = *(uint *)this;
  }
  if ((uVar1 & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_198," atomicCounterDecrement()",0x19);
  }
  pcVar4 = ".";
  bVar5 = (char)operations != '\0';
  if (bVar5) {
    pcVar4 = " calls with branches.";
  }
  lVar3 = 1;
  if (bVar5) {
    lVar3 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,pcVar4,lVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  psVar2 = (string *)std::ios_base::~ios_base(local_128);
  return psVar2;
}

Assistant:

string operationToDescription (const AtomicCounterTest::Operation& operations, bool useBranch)
{
	std::ostringstream	stream;
	bool				firstOperation = 0;

	stream
	<< "Test ";

	if ((operations & AtomicCounterTest::OPERATION_GET) != 0)
	{
		stream << "atomicCounter()";
		firstOperation = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_INC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterIncrement()";
		firstOperation = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_DEC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterDecrement()";
		firstOperation = false;
	}


	if (useBranch)
		stream << " calls with branches.";
	else
		stream << ".";

	return stream.str();
}